

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDL3OUTSIDE_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  double *in_R8;
  int unaff_retaddr;
  int *in_stack_00000010;
  
  TVar1 = TA_CDL3OUTSIDE(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                         (double *)CONCAT44(in_ESI,in_EDX),in_RCX,in_R8,
                         (double *)**(undefined8 **)(in_RDI + 0x18),in_stack_00000010,outNBElement,
                         outBegIdx);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDL3OUTSIDE_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDL3OUTSIDE(
/* Generated */                     startIdx,
/* Generated */                     endIdx,
/* Generated */                     params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                     params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                     params->in[0].data.inPrice.low, /* inLow */
/* Generated */                     params->in[0].data.inPrice.close, /* inClose */
/* Generated */                     outBegIdx, 
/* Generated */                     outNBElement, 
/* Generated */                     params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }